

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

bool __thiscall wabt::Module::IsImport(Module *this,ExternalKind kind,Var *var)

{
  Index IVar1;
  bool bVar2;
  
  switch(kind) {
  case First:
    IVar1 = BindingHash::FindIndex(&this->func_bindings,var);
    bVar2 = IVar1 < this->num_func_imports;
    break;
  case Table:
    IVar1 = BindingHash::FindIndex(&this->table_bindings,var);
    bVar2 = IVar1 < this->num_table_imports;
    break;
  case Memory:
    IVar1 = BindingHash::FindIndex(&this->memory_bindings,var);
    bVar2 = IVar1 < this->num_memory_imports;
    break;
  case Global:
    IVar1 = BindingHash::FindIndex(&this->global_bindings,var);
    bVar2 = IVar1 < this->num_global_imports;
    break;
  case Last:
    IVar1 = BindingHash::FindIndex(&this->tag_bindings,var);
    bVar2 = IVar1 < this->num_tag_imports;
    break;
  default:
    return false;
  }
  return bVar2;
}

Assistant:

bool Module::IsImport(ExternalKind kind, const Var& var) const {
  switch (kind) {
    case ExternalKind::Func:
      return GetFuncIndex(var) < num_func_imports;

    case ExternalKind::Global:
      return GetGlobalIndex(var) < num_global_imports;

    case ExternalKind::Memory:
      return GetMemoryIndex(var) < num_memory_imports;

    case ExternalKind::Table:
      return GetTableIndex(var) < num_table_imports;

    case ExternalKind::Tag:
      return GetTagIndex(var) < num_tag_imports;

    default:
      return false;
  }
}